

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

void __thiscall cfd::core::Block::Block(Block *this)

{
  BlockHeader *in_stack_ffffffffffffffe0;
  Block *this_local;
  
  this->_vptr_Block = (_func_int **)&PTR__Block_009fb7a8;
  ByteData::ByteData(&this->data_);
  BlockHeader::BlockHeader(in_stack_ffffffffffffffe0);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&this->txs_);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::vector(&this->txids_);
  return;
}

Assistant:

Block::Block() : data_() {
  // do nothing
}